

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn2.cpp
# Opt level: O1

void __thiscall YmFmOPN2::YmFmOPN2(YmFmOPN2 *this,OPNFamily f)

{
  ymfm_interface *intf;
  ym2612 *this_00;
  
  (this->super_OPNChipBaseT<YmFmOPN2>).super_OPNChipBase.m_id = 0;
  (this->super_OPNChipBaseT<YmFmOPN2>).super_OPNChipBase.m_rate = 0xac44;
  (this->super_OPNChipBaseT<YmFmOPN2>).super_OPNChipBase.m_clock = 0x750ab6;
  (this->super_OPNChipBaseT<YmFmOPN2>).super_OPNChipBase.m_family = f;
  (this->super_OPNChipBaseT<YmFmOPN2>).m_runningAtPcmRate = false;
  (this->super_OPNChipBaseT<YmFmOPN2>).m_oldsamples[0] = 0;
  (this->super_OPNChipBaseT<YmFmOPN2>).m_oldsamples[1] = 0;
  (this->super_OPNChipBaseT<YmFmOPN2>).m_samples[0] = 0;
  (this->super_OPNChipBaseT<YmFmOPN2>).m_samples[1] = 0;
  (this->super_OPNChipBaseT<YmFmOPN2>).m_samplecnt = 0;
  (this->super_OPNChipBaseT<YmFmOPN2>).m_rateratio = 0x34f;
  (this->super_OPNChipBaseT<YmFmOPN2>).super_OPNChipBase._vptr_OPNChipBase =
       (_func_int **)&PTR__YmFmOPN2_002202f8;
  this->m_headPos = 0;
  this->m_tailPos = 0;
  this->m_queueCount = 0;
  intf = (ymfm_interface *)operator_new(0x10);
  intf->m_engine = (ymfm_engine_callbacks *)&PTR_ymfm_sync_mode_write_002203e0;
  this->m_intf = intf;
  this_00 = (ym2612 *)operator_new(0xb28);
  ymfm::ym2612::ym2612(this_00,intf);
  this->m_chip = this_00;
  setRate(this,(this->super_OPNChipBaseT<YmFmOPN2>).super_OPNChipBase.m_rate,
          (this->super_OPNChipBaseT<YmFmOPN2>).super_OPNChipBase.m_clock);
  return;
}

Assistant:

YmFmOPN2::YmFmOPN2(OPNFamily f) :
    OPNChipBaseT(f),
    m_headPos(0),
    m_tailPos(0),
    m_queueCount(0)
{
    ymfm::ymfm_interface* intf = new ymfm::ymfm_interface;
    m_intf = intf;
    m_chip = new ymfm::ym2612(*intf);
    setRate(m_rate, m_clock);
}